

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<boost::python::numpy::ndarray_(DigitalConsumer_python::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<boost::python::numpy::ndarray,_DigitalConsumer_python_&>_>
::operator()(impl<boost::python::numpy::ndarray_(DigitalConsumer_python::*)(),_boost::python::default_call_policies,_boost::mpl::vector2<boost::python::numpy::ndarray,_DigitalConsumer_python_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  long lVar1;
  long *plVar2;
  code *pcVar3;
  PyObject *local_10;
  
  lVar1 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<DigitalConsumer_python_const_volatile&>::
                     converters);
  if (lVar1 == 0) {
    local_10 = (PyObject *)0x0;
  }
  else {
    pcVar3 = (code *)(this->m_data).
                     super_compressed_pair_imp<boost::python::numpy::ndarray_(DigitalConsumer_python::*)(),_boost::python::default_call_policies,_2>
                     .first_;
    plVar2 = (long *)(lVar1 + *(long *)&(this->m_data).
                                        super_compressed_pair_imp<boost::python::numpy::ndarray_(DigitalConsumer_python::*)(),_boost::python::default_call_policies,_2>
                                        .field_0x8);
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *plVar2 + -1);
    }
    (*pcVar3)(&local_10,plVar2);
    if (local_10->ob_refcnt == 0) {
      _Py_Dealloc(local_10);
    }
  }
  return local_10;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }